

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

void * __thiscall icu_63::UVector::orphanElementAt(UVector *this,int32_t index)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  
  if ((-1 < index) && (index < this->count)) {
    uVar2 = (ulong)(uint)index;
    pvVar1 = this->elements[uVar2].pointer;
    iVar3 = this->count + -1;
    if (index < iVar3) {
      do {
        this->elements[uVar2] = this->elements[uVar2 + 1];
        iVar3 = this->count + -1;
        index = index + 1;
        uVar2 = uVar2 + 1;
      } while (index < iVar3);
    }
    this->count = iVar3;
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void* UVector::orphanElementAt(int32_t index) {
    void* e = 0;
    if (0 <= index && index < count) {
        e = elements[index].pointer;
        for (int32_t i=index; i<count-1; ++i) {
            elements[i] = elements[i+1];
        }
        --count;
    }
    /* else index out of range */
    return e;
}